

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

TryEmplaceResult * __thiscall
QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
tryEmplace_impl<QHttp2Stream*const&>
          (TryEmplaceResult *__return_storage_ptr__,
          QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *this,
          QHttp2Stream **key)

{
  uchar uVar1;
  Span *pSVar2;
  Bucket BVar3;
  long lVar4;
  size_t hash;
  Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
  *pDVar5;
  Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *n;
  long in_FS_OFFSET;
  Bucket BVar6;
  Bucket local_50;
  QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)this;
  if (lVar4 == 0) {
    QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::detach
              ((QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this);
    lVar4 = *(long *)this;
  }
  local_40.d = (Data *)0x0;
  hash = qHash<QHttp2Stream_*,_true>(key,*(size_t *)(lVar4 + 0x18));
  BVar6 = QHashPrivate::
          Data<QHashPrivate::Node<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>>
          ::findBucketWithHash<QHttp2Stream*>
                    (*(Data<QHashPrivate::Node<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>>
                       **)this,key,hash);
  uVar1 = (BVar6.span)->offsets[BVar6.index];
  pDVar5 = *(Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
             **)this;
  local_50 = BVar6;
  if ((pDVar5 == (Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
                  *)0x0) || (1 < (uint)(pDVar5->ref).atomic._q_value.super___atomic_base<int>)) {
LAB_001e5511:
    QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::operator=
              (&local_40,
               (QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this);
    pDVar5 = *(Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
               **)this;
    if ((uVar1 == 0xff) && (pDVar5->numBuckets >> 1 <= pDVar5->size)) {
      pDVar5 = QHashPrivate::
               Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
               ::detached(pDVar5,pDVar5->size + 1);
      *(Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
        **)this = pDVar5;
      local_50 = QHashPrivate::
                 Data<QHashPrivate::Node<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>>
                 ::findBucketWithHash<QHttp2Stream*>
                           ((Data<QHashPrivate::Node<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>>
                             *)pDVar5,key,hash);
    }
    else {
      pSVar2 = pDVar5->spans;
      pDVar5 = QHashPrivate::
               Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
               ::detached(pDVar5);
      *(Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
        **)this = pDVar5;
      local_50.index._0_4_ = (uint)BVar6.index & 0x7f;
      BVar3.index._0_4_ = (uint)local_50.index;
      BVar3.span = pDVar5->spans +
                   ((((long)BVar6.span - (long)pSVar2) / 0x90 << 7 | BVar6.index) >> 7);
      BVar3.index._4_4_ = 0;
      local_50.span =
           pDVar5->spans + ((((long)BVar6.span - (long)pSVar2) / 0x90 << 7 | BVar6.index) >> 7);
      local_50.index._4_4_ = 0;
      if (uVar1 != 0xff) {
        pDVar5 = *(Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
                   **)this;
        BVar6 = BVar3;
        goto LAB_001e55d3;
      }
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_001e55d3;
    if (pDVar5->numBuckets >> 1 <= pDVar5->size) goto LAB_001e5511;
  }
  n = QHashPrivate::
      Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
      ::Bucket::insert(&local_50);
  QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::
  createInPlace<>(n,key);
  pDVar5 = *(Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
             **)this;
  pDVar5->size = pDVar5->size + 1;
  BVar6 = local_50;
LAB_001e55d3:
  pSVar2 = pDVar5->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar5;
  (__return_storage_ptr__->iterator).i.bucket =
       ((long)BVar6.span - (long)pSVar2) / 0x90 << 7 | BVar6.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }